

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vraster.cpp
# Opt level: O1

int __thiscall FTOutline::close(FTOutline *this,int __fd)

{
  short *psVar1;
  SW_FT_Vector *pSVar2;
  SW_FT_Vector *pSVar3;
  char *pcVar4;
  SW_FT_Pos SVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  
  (this->ft).contours_flag[(this->ft).n_contours] = '\0';
  lVar7 = (long)(this->ft).n_contours;
  if (lVar7 == 0) {
    iVar6 = 0;
  }
  else {
    iVar6 = (this->ft).contours[lVar7 + -1] + 1;
  }
  iVar8 = (int)(this->ft).n_points;
  if (iVar6 == iVar8) {
    this->closed = false;
    return iVar6;
  }
  pSVar3 = (this->ft).points;
  pSVar2 = pSVar3 + iVar6;
  SVar5 = pSVar2->y;
  pSVar3 = pSVar3 + iVar8;
  pSVar3->x = pSVar2->x;
  pSVar3->y = SVar5;
  pcVar4 = (this->ft).tags;
  pcVar4[iVar8] = '\x01';
  psVar1 = &(this->ft).n_points;
  *psVar1 = *psVar1 + 1;
  return (int)pcVar4;
}

Assistant:

void FTOutline::close()
{
    assert(ft.n_points <= SHRT_MAX - 1);

    // mark the contour as a close path.
    ft.contours_flag[ft.n_contours] = 0;

    int index;
    if (ft.n_contours) {
        index = ft.contours[ft.n_contours - 1] + 1;
    } else {
        index = 0;
    }

    // make sure atleast 1 point exists in the segment.
    if (ft.n_points == index) {
        closed = false;
        return;
    }

    ft.points[ft.n_points].x = ft.points[index].x;
    ft.points[ft.n_points].y = ft.points[index].y;
    ft.tags[ft.n_points] = SW_FT_CURVE_TAG_ON;
    ft.n_points++;
}